

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O2

size_t anon_unknown.dwarf_519f::GetSizeWithCallback
                 (void *ptr,_func_size_t_void_ptr *invalid_getsize_fn)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  
  uVar3 = (ulong)ptr >> 0xd;
  uVar5 = uVar3 & 0xffffffffffff0000 ^
          *(ulong *)(tcmalloc::Static::pageheap_ + (uVar3 & 0xffff) * 8 + 0x10);
  if (uVar5 < 0x80) {
    return (long)(int)(&DAT_0012ea44)[uVar5];
  }
  if ((((ulong)ptr >> 0x30 != 0) ||
      (*(long *)(tcmalloc::Static::pageheap_ + ((ulong)ptr >> 0x1f) * 8 + 0x80010) == 0)) ||
     (lVar2 = *(long *)(*(long *)(tcmalloc::Static::pageheap_ + ((ulong)ptr >> 0x1f) * 8 + 0x80010)
                       + (ulong)((uint)uVar3 & 0x3ffff) * 8), lVar2 == 0)) {
    sVar4 = (*invalid_getsize_fn)(ptr);
    return sVar4;
  }
  uVar1 = *(uint *)(lVar2 + 0x28);
  if ((uVar1 & 0xff0000) != 0) {
    return (long)*(int *)((long)&DAT_0012ea44 + (ulong)(uVar1 >> 0xe & 0x3fc));
  }
  if ((uVar1 >> 0x1a & 1) == 0) {
    return *(long *)(lVar2 + 8) << 0xd;
  }
  sVar4 = tc_nallocx(**(size_t **)(lVar2 + 0x20),0);
  return sVar4;
}

Assistant:

inline size_t GetSizeWithCallback(const void* ptr,
                                  size_t (*invalid_getsize_fn)(const void*)) {
  if (ptr == nullptr)
    return 0;
  const PageID p = reinterpret_cast<uintptr_t>(ptr) >> kPageShift;
  uint32_t cl;
  if (Static::pageheap()->TryGetSizeClass(p, &cl)) {
    return Static::sizemap()->ByteSizeForClass(cl);
  }

  const Span *span = Static::pageheap()->GetDescriptor(p);
  if (PREDICT_FALSE(span == nullptr)) {  // means we do not own this memory
    return (*invalid_getsize_fn)(ptr);
  }

  if (span->sizeclass != 0) {
    return Static::sizemap()->ByteSizeForClass(span->sizeclass);
  }

  if (span->sample) {
    size_t orig_size = reinterpret_cast<StackTrace*>(span->objects)->size;
    return tc_nallocx(orig_size, 0);
  }

  return span->length << kPageShift;
}